

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_read_tile_header
                   (opj_j2k_t *p_j2k,OPJ_UINT32 *p_tile_index,OPJ_UINT32 *p_data_size,
                   OPJ_INT32 *p_tile_x0,OPJ_INT32 *p_tile_y0,OPJ_INT32 *p_tile_x1,
                   OPJ_INT32 *p_tile_y1,OPJ_UINT32 *p_nb_comps,OPJ_BOOL *p_go_on,
                   opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  byte bVar1;
  OPJ_UINT32 tileno;
  uint uVar2;
  int iVar3;
  opj_codestream_index_t *poVar4;
  opj_tcp_t *poVar5;
  opj_tile_index_t *poVar6;
  void *__src;
  opj_ppx *poVar7;
  opj_tcd_tile_t *poVar8;
  opj_dec_memory_marker_handler_t *poVar9;
  OPJ_BOOL OVar10;
  uint uVar11;
  OPJ_UINT32 OVar12;
  OPJ_OFF_T OVar13;
  OPJ_SIZE_T OVar14;
  OPJ_BYTE *pOVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  OPJ_BYTE **ppOVar19;
  char *pcVar20;
  OPJ_INT32 event_type;
  opj_dec_memory_marker_handler_t *e;
  opj_dec_memory_marker_handler_t *poVar21;
  ulong uVar22;
  bool bVar23;
  OPJ_BYTE l_header_data [10];
  OPJ_UINT32 local_9c;
  char local_95;
  uint local_94;
  uint local_90;
  OPJ_UINT32 local_8c;
  OPJ_UINT32 local_88;
  OPJ_UINT32 local_84;
  OPJ_UINT32 local_80;
  OPJ_UINT32 local_7c;
  OPJ_UINT32 *local_78;
  undefined8 *local_70;
  OPJ_UINT32 *local_68;
  OPJ_UINT32 *local_60;
  OPJ_INT32 *local_58;
  OPJ_INT32 *local_50;
  OPJ_INT32 *local_48;
  OPJ_BYTE local_3a [10];
  
  local_9c = 0xff90;
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1eb4,
                  "OPJ_BOOL opj_j2k_read_tile_header(opj_j2k_t *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_UINT32 *, OPJ_BOOL *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1eb5,
                  "OPJ_BOOL opj_j2k_read_tile_header(opj_j2k_t *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_UINT32 *, OPJ_BOOL *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  local_68 = p_tile_index;
  local_60 = p_data_size;
  local_58 = p_tile_x0;
  local_50 = p_tile_y0;
  local_48 = p_tile_x1;
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1eb6,
                  "OPJ_BOOL opj_j2k_read_tile_header(opj_j2k_t *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_UINT32 *, OPJ_BOOL *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  OVar12 = (p_j2k->m_specific_param).m_decoder.m_state;
  if (OVar12 != 8) {
    if (OVar12 != 0x100) {
      return 0;
    }
    local_9c = 0xffd9;
  }
  if (((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 1) == 0) && (local_9c != 0xffd9)) {
    local_70 = (undefined8 *)((long)&p_j2k->m_specific_param + 0x10);
    local_78 = &(p_j2k->m_specific_param).m_decoder.m_sot_length;
LAB_0010cbfe:
    while (local_9c == 0xff93) {
LAB_0010ce02:
      OVar13 = opj_stream_get_number_byte_left(p_stream);
      if ((OVar13 == 0) && ((p_j2k->m_specific_param).m_decoder.m_state == 0x40)) goto LAB_0010d21a;
      bVar1 = *(byte *)((long)&p_j2k->m_specific_param + 0x54);
      if ((bVar1 & 4) == 0) {
        uVar17 = p_j2k->m_current_tile_number;
        poVar5 = (p_j2k->m_cp).tcps;
        if ((p_j2k->m_specific_param).m_decoder.m_last_tile_part == 0) {
          uVar11 = *local_78;
          if (1 < uVar11) goto LAB_0010ce6b;
        }
        else {
          OVar13 = opj_stream_get_number_byte_left(p_stream);
          uVar11 = (uint)OVar13;
LAB_0010ce6b:
          *local_78 = uVar11 - 2;
        }
        uVar16 = (ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length;
        if (uVar16 != 0) {
          OVar13 = opj_stream_get_number_byte_left(p_stream);
          if (OVar13 < (long)uVar16) {
            opj_event_msg(p_manager,2,"Tile part length size inconsistent with stream length\n");
          }
          if (poVar5[uVar17].m_data == (OPJ_BYTE *)0x0) {
            pOVar15 = (OPJ_BYTE *)
                      opj_malloc((ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length);
          }
          else {
            pOVar15 = (OPJ_BYTE *)
                      opj_realloc(poVar5[uVar17].m_data,
                                  (ulong)((p_j2k->m_specific_param).m_decoder.m_sot_length +
                                         poVar5[uVar17].m_data_size));
            if (pOVar15 == (OPJ_BYTE *)0x0) {
              opj_free(poVar5[uVar17].m_data);
            }
          }
          poVar5[uVar17].m_data = pOVar15;
          if (pOVar15 == (OPJ_BYTE *)0x0) {
            pcVar20 = "Not enough memory to decode tile\n";
            goto LAB_0010d597;
          }
        }
        poVar4 = p_j2k->cstr_index;
        if (poVar4 != (opj_codestream_index_t *)0x0) {
          OVar13 = opj_stream_tell(p_stream);
          poVar6 = poVar4->tile_index;
          uVar11 = p_j2k->m_current_tile_number;
          uVar2 = poVar6[uVar11].current_tpsno;
          poVar6[uVar11].tp_index[uVar2].end_header = OVar13 + -2;
          poVar6[uVar11].tp_index[uVar2].end_pos =
               (ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length + OVar13;
          OVar10 = opj_j2k_add_tlmarker
                             (uVar11,poVar4,0xff93,OVar13 + -2,
                              (p_j2k->m_specific_param).m_decoder.m_sot_length + 2);
          if (OVar10 == 0) {
LAB_0010d531:
            pcVar20 = "Not enough memory to add tl marker\n";
            goto LAB_0010d597;
          }
        }
        if (uVar16 == 0) {
          OVar14 = 0;
        }
        else {
          OVar14 = opj_stream_read_data
                             (p_stream,poVar5[uVar17].m_data + poVar5[uVar17].m_data_size,
                              (ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length,p_manager);
        }
        OVar12 = 0x40;
        if (OVar14 == (p_j2k->m_specific_param).m_decoder.m_sot_length) {
          OVar12 = 8;
        }
        (p_j2k->m_specific_param).m_decoder.m_state = OVar12;
        poVar5[uVar17].m_data_size = poVar5[uVar17].m_data_size + (int)OVar14;
        bVar1 = *(byte *)((long)&p_j2k->m_specific_param + 0x54);
        if ((bVar1 & 9) == 1) {
          *(byte *)((long)&p_j2k->m_specific_param + 0x54) = bVar1 | 8;
          OVar12 = p_j2k->m_current_tile_number;
          OVar10 = opj_stream_has_seek(p_stream);
          local_95 = '\x01';
          if ((OVar10 == 0) || (OVar13 = opj_stream_tell(p_stream), OVar13 == -1)) {
            bVar23 = true;
          }
          else {
            do {
              OVar14 = opj_stream_read_data(p_stream,local_3a,2,p_manager);
              if ((OVar14 != 2) || (opj_read_bytes_LE(local_3a,&local_7c,2), local_7c != 0xff90))
              break;
              OVar14 = opj_stream_read_data(p_stream,local_3a,2,p_manager);
              if (OVar14 != 2) {
LAB_0010d0e3:
                pcVar20 = "Stream too short\n";
LAB_0010d109:
                bVar23 = false;
                opj_event_msg(p_manager,1,pcVar20);
                goto LAB_0010d138;
              }
              opj_read_bytes_LE(local_3a,&local_8c,2);
              if (local_8c != 10) {
                pcVar20 = "Inconsistent marker size\n";
                goto LAB_0010d109;
              }
              local_8c = 8;
              OVar14 = opj_stream_read_data(p_stream,local_3a,8,p_manager);
              if (OVar14 != local_8c) goto LAB_0010d0e3;
              OVar10 = opj_j2k_get_sot_values
                                 (local_3a,local_8c,&local_80,&local_90,&local_84,&local_88,
                                  p_manager);
              if (OVar10 == 0) {
                bVar23 = false;
                goto LAB_0010d138;
              }
              if (local_80 == OVar12) {
                local_95 = local_84 != local_88;
                break;
              }
              if (local_90 < 0xe) break;
              local_90 = local_90 - 0xc;
              uVar16 = opj_stream_skip(p_stream,(ulong)local_90,p_manager);
            } while (uVar16 == local_90);
            OVar10 = opj_stream_seek(p_stream,OVar13,p_manager);
            bVar23 = OVar10 != 0;
          }
LAB_0010d138:
          if (bVar23) {
            if (local_95 == '\0') {
              uVar17 = (p_j2k->m_cp).th * (p_j2k->m_cp).tw;
              *(byte *)((long)&p_j2k->m_specific_param + 0x54) =
                   *(byte *)((long)&p_j2k->m_specific_param + 0x54) & 0xee | 0x10;
              if (uVar17 != 0) {
                poVar5 = (p_j2k->m_cp).tcps;
                lVar18 = 0;
                do {
                  iVar3 = *(int *)((long)&poVar5->m_nb_tile_parts + lVar18);
                  if (iVar3 != 0) {
                    *(int *)((long)&poVar5->m_nb_tile_parts + lVar18) = iVar3 + 1;
                  }
                  lVar18 = lVar18 + 0x1640;
                } while ((ulong)uVar17 * 0x1640 - lVar18 != 0);
              }
              event_type = 2;
              pcVar20 = "Non conformant codestream TPsot==TNsot.\n";
              goto LAB_0010d1b5;
            }
          }
          else {
            event_type = 1;
            pcVar20 = "opj_j2k_apply_nb_tile_parts_correction error\n";
LAB_0010d1b5:
            opj_event_msg(p_manager,event_type,pcVar20);
          }
          if (!bVar23) {
            return 0;
          }
        }
        if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 1) == 0) {
          pOVar15 = (OPJ_BYTE *)*local_70;
          goto LAB_0010d1d4;
        }
      }
      else {
        *(byte *)((long)&p_j2k->m_specific_param + 0x54) = bVar1 & 0xfa;
        (p_j2k->m_specific_param).m_decoder.m_state = 8;
        pOVar15 = (p_j2k->m_specific_param).m_decoder.m_header_data;
LAB_0010d1d4:
        OVar14 = opj_stream_read_data(p_stream,pOVar15,2,p_manager);
        if (OVar14 != 2) goto LAB_0010d32c;
        opj_read_bytes_LE((OPJ_BYTE *)*local_70,&local_9c,2);
      }
      if (((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 1) != 0) || (local_9c == 0xffd9))
      goto LAB_0010d21a;
    }
    OVar13 = opj_stream_get_number_byte_left(p_stream);
    if (OVar13 == 0) {
LAB_0010cdfa:
      (p_j2k->m_specific_param).m_decoder.m_state = 0x40;
      goto LAB_0010ce02;
    }
    OVar14 = opj_stream_read_data
                       (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
    if (OVar14 != 2) goto LAB_0010d32c;
    opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_94,2);
    if (local_94 < 2) {
      pcVar20 = "Inconsistent marker size\n";
      goto LAB_0010d597;
    }
    if ((local_9c == 0x8080) && (OVar13 = opj_stream_get_number_byte_left(p_stream), OVar13 == 0))
    goto LAB_0010cdfa;
    uVar17 = (p_j2k->m_specific_param).m_decoder.m_state;
    if ((uVar17 & 0x10) != 0) {
      (p_j2k->m_specific_param).m_decoder.m_sot_length =
           ((p_j2k->m_specific_param).m_decoder.m_sot_length - local_94) - 2;
    }
    local_94 = local_94 - 2;
    poVar9 = j2k_memory_marker_handler_tab;
    do {
      poVar21 = poVar9;
      OVar12 = poVar21->id;
      if (OVar12 == 0) break;
      poVar9 = poVar21 + 1;
    } while (OVar12 != local_9c);
    if ((poVar21->states & uVar17) == 0) {
      pcVar20 = "Marker is not compliant with its position\n";
      goto LAB_0010d597;
    }
    if ((p_j2k->m_specific_param).m_decoder.m_header_data_size < local_94) {
      uVar16 = (ulong)local_94;
      OVar13 = opj_stream_get_number_byte_left(p_stream);
      if (OVar13 < (long)uVar16) {
        pcVar20 = "Marker size inconsistent with stream length\n";
        goto LAB_0010d597;
      }
      pOVar15 = (OPJ_BYTE *)
                opj_realloc((p_j2k->m_specific_param).m_decoder.m_header_data,(ulong)local_94);
      if (pOVar15 == (OPJ_BYTE *)0x0) {
        opj_free((p_j2k->m_specific_param).m_decoder.m_header_data);
        (p_j2k->m_specific_param).m_decoder.m_header_data = (OPJ_BYTE *)0x0;
        (p_j2k->m_specific_param).m_decoder.m_header_data_size = 0;
        pcVar20 = "Not enough memory to read header\n";
        goto LAB_0010d597;
      }
      (p_j2k->m_specific_param).m_decoder.m_header_data = pOVar15;
      (p_j2k->m_specific_param).m_decoder.m_header_data_size = local_94;
    }
    OVar14 = opj_stream_read_data
                       (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,(ulong)local_94,
                        p_manager);
    if (OVar14 == local_94) {
      if (poVar21->handler ==
          (_func_OPJ_BOOL_opj_j2k_t_ptr_OPJ_BYTE_ptr_OPJ_UINT32_opj_event_mgr_t_ptr *)0x0) {
        pcVar20 = "Not sure how that happened.\n";
        goto LAB_0010d597;
      }
      OVar10 = (*poVar21->handler)(p_j2k,(p_j2k->m_specific_param).m_decoder.m_header_data,local_94,
                                   p_manager);
      if (OVar10 == 0) {
        opj_event_msg(p_manager,1,"Fail to read the current marker segment (%#x)\n",(ulong)local_9c)
        ;
        return 0;
      }
      tileno = p_j2k->m_current_tile_number;
      poVar4 = p_j2k->cstr_index;
      OVar13 = opj_stream_tell(p_stream);
      OVar10 = opj_j2k_add_tlmarker
                         (tileno,poVar4,OVar12,(ulong)(((int)OVar13 - local_94) - 4),local_94 + 4);
      if (OVar10 == 0) goto LAB_0010d531;
      if (OVar12 == 0xff90) {
        OVar13 = opj_stream_tell(p_stream);
        uVar16 = (ulong)(((int)OVar13 - local_94) - 4);
        if ((p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos < (long)uVar16) {
          (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = uVar16;
        }
      }
      if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 4) != 0) {
        uVar16 = opj_stream_skip(p_stream,(ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length,
                                 p_manager);
        if (uVar16 != (p_j2k->m_specific_param).m_decoder.m_sot_length) goto LAB_0010d32c;
        local_9c = 0xff93;
        goto LAB_0010cbfe;
      }
      OVar14 = opj_stream_read_data
                         (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
      if (OVar14 == 2) {
        opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_9c,2);
        goto LAB_0010cbfe;
      }
    }
LAB_0010d32c:
    pcVar20 = "Stream too short\n";
    goto LAB_0010d597;
  }
LAB_0010d21a:
  if ((local_9c == 0xffd9) && ((p_j2k->m_specific_param).m_decoder.m_state != 0x100)) {
    p_j2k->m_current_tile_number = 0;
    (p_j2k->m_specific_param).m_decoder.m_state = 0x100;
  }
  if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 1) == 0) {
    uVar17 = p_j2k->m_current_tile_number;
    uVar16 = (ulong)uVar17;
    uVar11 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
    if (uVar17 < uVar11) {
      ppOVar19 = &(p_j2k->m_cp).tcps[uVar16].m_data;
      do {
        uVar17 = (uint)uVar16;
        if (*ppOVar19 != (OPJ_BYTE *)0x0) break;
        uVar17 = uVar17 + 1;
        uVar16 = (ulong)uVar17;
        p_j2k->m_current_tile_number = uVar17;
        ppOVar19 = ppOVar19 + 0x2c8;
      } while (uVar11 != uVar17);
    }
    if (uVar17 == uVar11) {
      *p_go_on = 0;
    }
    if (uVar17 == uVar11) {
      return (uint)(uVar17 == uVar11);
    }
  }
  poVar5 = (p_j2k->m_cp).tcps;
  if (poVar5 == (opj_tcp_t *)0x0) {
    __assert_fail("p_tcp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xf1e,"OPJ_BOOL opj_j2k_merge_ppt(opj_tcp_t *, opj_event_mgr_t *)");
  }
  uVar17 = p_j2k->m_current_tile_number;
  if (poVar5[uVar17].ppt_buffer != (OPJ_BYTE *)0x0) {
    __assert_fail("p_tcp->ppt_buffer == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xf20,"OPJ_BOOL opj_j2k_merge_ppt(opj_tcp_t *, opj_event_mgr_t *)");
  }
  if ((poVar5[uVar17].field_0x1638 & 2) != 0) {
    if ((ulong)poVar5[uVar17].ppt_markers_count == 0) {
      uVar11 = 0;
    }
    else {
      lVar18 = 0;
      uVar11 = 0;
      do {
        uVar11 = uVar11 + *(int *)((long)&(poVar5[uVar17].ppt_markers)->m_data_size + lVar18);
        lVar18 = lVar18 + 0x10;
      } while ((ulong)poVar5[uVar17].ppt_markers_count << 4 != lVar18);
    }
    pOVar15 = (OPJ_BYTE *)opj_malloc((ulong)uVar11);
    poVar5[uVar17].ppt_buffer = pOVar15;
    if (pOVar15 == (OPJ_BYTE *)0x0) {
      opj_event_msg(p_manager,1,"Not enough memory to read PPT marker\n");
      pcVar20 = "Failed to merge PPT data\n";
      goto LAB_0010d597;
    }
    poVar5[uVar17].ppt_len = uVar11;
    if (poVar5[uVar17].ppt_markers_count != 0) {
      uVar16 = 0;
      lVar18 = 8;
      uVar22 = 0;
      do {
        __src = *(void **)((long)poVar5[uVar17].ppt_markers + lVar18 + -8);
        if (__src != (void *)0x0) {
          memcpy(poVar5[uVar17].ppt_buffer + uVar22,__src,
                 (ulong)*(uint *)((long)&(poVar5[uVar17].ppt_markers)->m_data + lVar18));
          uVar22 = (ulong)(uint)((int)uVar22 +
                                *(int *)((long)&(poVar5[uVar17].ppt_markers)->m_data + lVar18));
          opj_free(*(void **)((long)poVar5[uVar17].ppt_markers + lVar18 + -8));
          poVar7 = poVar5[uVar17].ppt_markers;
          *(undefined8 *)((long)poVar7 + lVar18 + -8) = 0;
          *(undefined4 *)((long)&poVar7->m_data + lVar18) = 0;
        }
        uVar16 = uVar16 + 1;
        lVar18 = lVar18 + 0x10;
      } while (uVar16 < poVar5[uVar17].ppt_markers_count);
    }
    poVar5[uVar17].ppt_markers_count = 0;
    opj_free(poVar5[uVar17].ppt_markers);
    poVar5[uVar17].ppt_markers = (opj_ppx *)0x0;
    poVar5[uVar17].ppt_data = poVar5[uVar17].ppt_buffer;
    poVar5[uVar17].ppt_data_size = poVar5[uVar17].ppt_len;
  }
  OVar10 = opj_tcd_init_decode_tile(p_j2k->m_tcd,p_j2k->m_current_tile_number,p_manager);
  if (OVar10 != 0) {
    opj_event_msg(p_manager,4,"Header of tile %d / %d has been read.\n",
                  (ulong)(p_j2k->m_current_tile_number + 1),
                  (ulong)((p_j2k->m_cp).tw * (p_j2k->m_cp).th));
    *local_68 = p_j2k->m_current_tile_number;
    *p_go_on = 1;
    OVar12 = opj_tcd_get_decoded_tile_size(p_j2k->m_tcd);
    *local_60 = OVar12;
    poVar8 = p_j2k->m_tcd->tcd_image->tiles;
    *local_58 = poVar8->x0;
    *local_50 = poVar8->y0;
    *local_48 = poVar8->x1;
    *p_tile_y1 = poVar8->y1;
    *p_nb_comps = poVar8->numcomps;
    *(byte *)&p_j2k->m_specific_param = *(byte *)&p_j2k->m_specific_param | 0x80;
    return 1;
  }
  pcVar20 = "Cannot decode tile, memory error\n";
LAB_0010d597:
  opj_event_msg(p_manager,1,pcVar20);
  return 0;
}

Assistant:

OPJ_BOOL opj_j2k_read_tile_header(      opj_j2k_t * p_j2k,
                                                                    OPJ_UINT32 * p_tile_index,
                                                                    OPJ_UINT32 * p_data_size,
                                                                    OPJ_INT32 * p_tile_x0, OPJ_INT32 * p_tile_y0,
                                                                    OPJ_INT32 * p_tile_x1, OPJ_INT32 * p_tile_y1,
                                                                    OPJ_UINT32 * p_nb_comps,
                                                                    OPJ_BOOL * p_go_on,
                                                                    opj_stream_private_t *p_stream,
                                                                    opj_event_mgr_t * p_manager )
{
        OPJ_UINT32 l_current_marker = J2K_MS_SOT;
        OPJ_UINT32 l_marker_size;
        const opj_dec_memory_marker_handler_t * l_marker_handler = 00;
        opj_tcp_t * l_tcp = NULL;

        /* preconditions */
        assert(p_stream != 00);
        assert(p_j2k != 00);
        assert(p_manager != 00);

        /* Reach the End Of Codestream ?*/
        if (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_EOC){
                l_current_marker = J2K_MS_EOC;
        }
        /* We need to encounter a SOT marker (a new tile-part header) */
        else if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_TPHSOT){
                return OPJ_FALSE;
        }

        /* Read into the codestream until reach the EOC or ! can_decode ??? FIXME */
        while ( (!p_j2k->m_specific_param.m_decoder.m_can_decode) && (l_current_marker != J2K_MS_EOC) ) {

                /* Try to read until the Start Of Data is detected */
                while (l_current_marker != J2K_MS_SOD) {
                    
                    if(opj_stream_get_number_byte_left(p_stream) == 0)
                    {
                        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_NEOC;
                        break;
                    }

                        /* Try to read 2 bytes (the marker size) from stream and copy them into the buffer */
                        if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                                opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                return OPJ_FALSE;
                        }

                        /* Read 2 bytes from the buffer as the marker size */
                        opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_marker_size,2);

                        /* Check marker size (does not include marker ID but includes marker size) */
                        if (l_marker_size < 2) {
                                opj_event_msg(p_manager, EVT_ERROR, "Inconsistent marker size\n");
                                return OPJ_FALSE;
                        }

                        /* cf. https://code.google.com/p/openjpeg/issues/detail?id=226 */
                        if (l_current_marker == 0x8080 && opj_stream_get_number_byte_left(p_stream) == 0) {
                                p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_NEOC;
                                break;
                        }

                        /* Why this condition? FIXME */
                        if (p_j2k->m_specific_param.m_decoder.m_state & J2K_STATE_TPH){
                                p_j2k->m_specific_param.m_decoder.m_sot_length -= (l_marker_size + 2);
                        }
                        l_marker_size -= 2; /* Subtract the size of the marker ID already read */

                        /* Get the marker handler from the marker ID */
                        l_marker_handler = opj_j2k_get_marker_handler(l_current_marker);

                        /* Check if the marker is known and if it is the right place to find it */
                        if (! (p_j2k->m_specific_param.m_decoder.m_state & l_marker_handler->states) ) {
                                opj_event_msg(p_manager, EVT_ERROR, "Marker is not compliant with its position\n");
                                return OPJ_FALSE;
                        }
/* FIXME manage case of unknown marker as in the main header ? */

                        /* Check if the marker size is compatible with the header data size */
                        if (l_marker_size > p_j2k->m_specific_param.m_decoder.m_header_data_size) {
                                OPJ_BYTE *new_header_data = NULL;
                                /* If we are here, this means we consider this marker as known & we will read it */
                                /* Check enough bytes left in stream before allocation */
                                if ((OPJ_OFF_T)l_marker_size >  opj_stream_get_number_byte_left(p_stream)) {
                                        opj_event_msg(p_manager, EVT_ERROR, "Marker size inconsistent with stream length\n");
                                        return OPJ_FALSE;
                                }
                                new_header_data = (OPJ_BYTE *) opj_realloc(p_j2k->m_specific_param.m_decoder.m_header_data, l_marker_size);
                                if (! new_header_data) {
                                        opj_free(p_j2k->m_specific_param.m_decoder.m_header_data);
                                        p_j2k->m_specific_param.m_decoder.m_header_data = NULL;
                                        p_j2k->m_specific_param.m_decoder.m_header_data_size = 0;
                                        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read header\n");
                                        return OPJ_FALSE;
                                }
                                p_j2k->m_specific_param.m_decoder.m_header_data = new_header_data;
                                p_j2k->m_specific_param.m_decoder.m_header_data_size = l_marker_size;
                        }

                        /* Try to read the rest of the marker segment from stream and copy them into the buffer */
                        if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager) != l_marker_size) {
                                opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                return OPJ_FALSE;
                        }

                        if (!l_marker_handler->handler) {
                                /* See issue #175 */
                                opj_event_msg(p_manager, EVT_ERROR, "Not sure how that happened.\n");
                                return OPJ_FALSE;
                        }
                        /* Read the marker segment with the correct marker handler */
                        if (! (*(l_marker_handler->handler))(p_j2k,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager)) {
                                opj_event_msg(p_manager, EVT_ERROR, "Fail to read the current marker segment (%#x)\n", l_current_marker);
                                return OPJ_FALSE;
                        }

                        /* Add the marker to the codestream index*/
                        if (OPJ_FALSE == opj_j2k_add_tlmarker(p_j2k->m_current_tile_number,
                                                p_j2k->cstr_index,
                                                l_marker_handler->id,
                                                (OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4,
                                                l_marker_size + 4 )) {
                                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to add tl marker\n");
                                return OPJ_FALSE;
                        }

                        /* Keep the position of the last SOT marker read */
                        if ( l_marker_handler->id == J2K_MS_SOT ) {
                                OPJ_UINT32 sot_pos = (OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4 ;
                                if (sot_pos > p_j2k->m_specific_param.m_decoder.m_last_sot_read_pos)
                                {
                                        p_j2k->m_specific_param.m_decoder.m_last_sot_read_pos = sot_pos;
                                }
                        }

                        if (p_j2k->m_specific_param.m_decoder.m_skip_data) {
                                /* Skip the rest of the tile part header*/
                                if (opj_stream_skip(p_stream,p_j2k->m_specific_param.m_decoder.m_sot_length,p_manager) != p_j2k->m_specific_param.m_decoder.m_sot_length) {
                                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                        return OPJ_FALSE;
                                }
                                l_current_marker = J2K_MS_SOD; /* Normally we reached a SOD */
                        }
                        else {
                                /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer*/
                                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                        return OPJ_FALSE;
                                }
                                /* Read 2 bytes from the buffer as the new marker ID */
                                opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
                        }
                }
                if(opj_stream_get_number_byte_left(p_stream) == 0
                    && p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_NEOC)
                    break;

                /* If we didn't skip data before, we need to read the SOD marker*/
                if (! p_j2k->m_specific_param.m_decoder.m_skip_data) {
                        /* Try to read the SOD marker and skip data ? FIXME */
                        if (! opj_j2k_read_sod(p_j2k, p_stream, p_manager)) {
                                return OPJ_FALSE;
                        }
                        if (p_j2k->m_specific_param.m_decoder.m_can_decode && !p_j2k->m_specific_param.m_decoder.m_nb_tile_parts_correction_checked) {
                                /* Issue 254 */
                                OPJ_BOOL l_correction_needed;
													
                                p_j2k->m_specific_param.m_decoder.m_nb_tile_parts_correction_checked = 1;
                                if(!opj_j2k_need_nb_tile_parts_correction(p_stream, p_j2k->m_current_tile_number, &l_correction_needed, p_manager)) {
                                        opj_event_msg(p_manager, EVT_ERROR, "opj_j2k_apply_nb_tile_parts_correction error\n");
                                        return OPJ_FALSE;
                                }
                                if (l_correction_needed) {
                                        OPJ_UINT32 l_nb_tiles = p_j2k->m_cp.tw * p_j2k->m_cp.th;
                                        OPJ_UINT32 l_tile_no;

                                        p_j2k->m_specific_param.m_decoder.m_can_decode = 0;
                                        p_j2k->m_specific_param.m_decoder.m_nb_tile_parts_correction = 1;
                                        /* correct tiles */
                                        for (l_tile_no = 0U; l_tile_no < l_nb_tiles; ++l_tile_no) {
                                                if (p_j2k->m_cp.tcps[l_tile_no].m_nb_tile_parts != 0U) {
                                                        p_j2k->m_cp.tcps[l_tile_no].m_nb_tile_parts+=1;
                                                }
                                        }
                                        opj_event_msg(p_manager, EVT_WARNING, "Non conformant codestream TPsot==TNsot.\n");
                                }
                        }
                        if (! p_j2k->m_specific_param.m_decoder.m_can_decode){
                                /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
                                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                        return OPJ_FALSE;
                                }

                                /* Read 2 bytes from buffer as the new marker ID */
                                opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
                        }
                }
                else {
                        /* Indicate we will try to read a new tile-part header*/
                        p_j2k->m_specific_param.m_decoder.m_skip_data = 0;
                        p_j2k->m_specific_param.m_decoder.m_can_decode = 0;
                        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_TPHSOT;

                        /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
                        if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                                opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                return OPJ_FALSE;
                        }

                        /* Read 2 bytes from buffer as the new marker ID */
                        opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
                }
        }

        /* Current marker is the EOC marker ?*/
        if (l_current_marker == J2K_MS_EOC) {
                if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_EOC ){
                        p_j2k->m_current_tile_number = 0;
                        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_EOC;
                }
        }

        /* FIXME DOC ???*/
        if ( ! p_j2k->m_specific_param.m_decoder.m_can_decode) {
                OPJ_UINT32 l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;
                l_tcp = p_j2k->m_cp.tcps + p_j2k->m_current_tile_number;

                while( (p_j2k->m_current_tile_number < l_nb_tiles) && (l_tcp->m_data == 00) ) {
                        ++p_j2k->m_current_tile_number;
                        ++l_tcp;
                }

                if (p_j2k->m_current_tile_number == l_nb_tiles) {
                        *p_go_on = OPJ_FALSE;
                        return OPJ_TRUE;
                }
        }

        if (! opj_j2k_merge_ppt(p_j2k->m_cp.tcps + p_j2k->m_current_tile_number, p_manager)) {
                opj_event_msg(p_manager, EVT_ERROR, "Failed to merge PPT data\n");
                return OPJ_FALSE;
        }
        /*FIXME ???*/
        if (! opj_tcd_init_decode_tile(p_j2k->m_tcd, p_j2k->m_current_tile_number, p_manager)) {
                opj_event_msg(p_manager, EVT_ERROR, "Cannot decode tile, memory error\n");
                return OPJ_FALSE;
        }

        opj_event_msg(p_manager, EVT_INFO, "Header of tile %d / %d has been read.\n",
                        p_j2k->m_current_tile_number+1, (p_j2k->m_cp.th * p_j2k->m_cp.tw));

        *p_tile_index = p_j2k->m_current_tile_number;
        *p_go_on = OPJ_TRUE;
        *p_data_size = opj_tcd_get_decoded_tile_size(p_j2k->m_tcd);
        *p_tile_x0 = p_j2k->m_tcd->tcd_image->tiles->x0;
        *p_tile_y0 = p_j2k->m_tcd->tcd_image->tiles->y0;
        *p_tile_x1 = p_j2k->m_tcd->tcd_image->tiles->x1;
        *p_tile_y1 = p_j2k->m_tcd->tcd_image->tiles->y1;
        *p_nb_comps = p_j2k->m_tcd->tcd_image->tiles->numcomps;

         p_j2k->m_specific_param.m_decoder.m_state |= 0x0080;/* FIXME J2K_DEC_STATE_DATA;*/

        return OPJ_TRUE;
}